

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall Matrix<Rational>::operator==(Matrix<Rational> *this,Matrix<Rational> *a)

{
  compare_t cVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  
  if (this->M != a->M) {
    return false;
  }
  if (this->N == a->N) {
    if (this->M * this->N == 0) {
      bVar4 = true;
    }
    else {
      lVar3 = 0;
      uVar2 = 0;
      do {
        cVar1 = Rational::compare((Rational *)
                                  ((long)&(this->arr->_numerator).digits.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar3),
                                  (Rational *)
                                  ((long)&(a->arr->_numerator).digits.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar3));
        bVar4 = cVar1 == CMP_EQUAL;
        if (!bVar4) {
          return bVar4;
        }
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x40;
      } while (uVar2 < this->M * this->N);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Matrix<Field>::operator==(const Matrix &a) const
{
    if(M != a.M || N != a.N)
        return false;
    for(unsigned i = 0; i < N * M; ++i)
    {
        if(arr[i] != a.arr[i])
            return false;
    }
    return true;
}